

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeIndexedVector.h
# Opt level: O1

void __thiscall
slang::
SafeIndexedVector<slang::ast::Scope::DeferredMemberData,_slang::ast::Scope::DeferredMemberIndex>::
SafeIndexedVector(SafeIndexedVector<slang::ast::Scope::DeferredMemberData,_slang::ast::Scope::DeferredMemberIndex>
                  *this)

{
  pointer *ppDVar1;
  iterator __position;
  
  (this->freelist).
  super__Deque_base<slang::ast::Scope::DeferredMemberIndex,_std::allocator<slang::ast::Scope::DeferredMemberIndex>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->freelist).
  super__Deque_base<slang::ast::Scope::DeferredMemberIndex,_std::allocator<slang::ast::Scope::DeferredMemberIndex>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->freelist).
  super__Deque_base<slang::ast::Scope::DeferredMemberIndex,_std::allocator<slang::ast::Scope::DeferredMemberIndex>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->freelist).
  super__Deque_base<slang::ast::Scope::DeferredMemberIndex,_std::allocator<slang::ast::Scope::DeferredMemberIndex>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->freelist).
  super__Deque_base<slang::ast::Scope::DeferredMemberIndex,_std::allocator<slang::ast::Scope::DeferredMemberIndex>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->freelist).
  super__Deque_base<slang::ast::Scope::DeferredMemberIndex,_std::allocator<slang::ast::Scope::DeferredMemberIndex>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->freelist).
  super__Deque_base<slang::ast::Scope::DeferredMemberIndex,_std::allocator<slang::ast::Scope::DeferredMemberIndex>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->freelist).
  super__Deque_base<slang::ast::Scope::DeferredMemberIndex,_std::allocator<slang::ast::Scope::DeferredMemberIndex>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->storage).
  super__Vector_base<slang::ast::Scope::DeferredMemberData,_std::allocator<slang::ast::Scope::DeferredMemberData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->freelist).
  super__Deque_base<slang::ast::Scope::DeferredMemberIndex,_std::allocator<slang::ast::Scope::DeferredMemberIndex>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->storage).
  super__Vector_base<slang::ast::Scope::DeferredMemberData,_std::allocator<slang::ast::Scope::DeferredMemberData>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->storage).
  super__Vector_base<slang::ast::Scope::DeferredMemberData,_std::allocator<slang::ast::Scope::DeferredMemberData>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->freelist).
  super__Deque_base<slang::ast::Scope::DeferredMemberIndex,_std::allocator<slang::ast::Scope::DeferredMemberIndex>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<slang::ast::Scope::DeferredMemberIndex,_std::allocator<slang::ast::Scope::DeferredMemberIndex>_>
  ::_M_initialize_map(&(this->freelist).
                       super__Deque_base<slang::ast::Scope::DeferredMemberIndex,_std::allocator<slang::ast::Scope::DeferredMemberIndex>_>
                      ,0);
  __position._M_current =
       (this->storage).
       super__Vector_base<slang::ast::Scope::DeferredMemberData,_std::allocator<slang::ast::Scope::DeferredMemberData>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->storage).
      super__Vector_base<slang::ast::Scope::DeferredMemberData,_std::allocator<slang::ast::Scope::DeferredMemberData>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<slang::ast::Scope::DeferredMemberData,_std::allocator<slang::ast::Scope::DeferredMemberData>_>
    ::_M_realloc_insert<>(&this->storage,__position);
  }
  else {
    ((__position._M_current)->portDecls).
    super__Vector_base<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__position._M_current)->hasEnums = false;
    (__position._M_current)->hasBinds = false;
    (__position._M_current)->isUncacheable = false;
    *(undefined5 *)&(__position._M_current)->field_0x4b = 0;
    ((__position._M_current)->portDecls).
    super__Vector_base<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ((__position._M_current)->portDecls).
    super__Vector_base<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ((__position._M_current)->forwardingTypedefs).
    super__Vector_base<const_slang::ast::ForwardingTypedefSymbol_*,_std::allocator<const_slang::ast::ForwardingTypedefSymbol_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ((__position._M_current)->forwardingTypedefs).
    super__Vector_base<const_slang::ast::ForwardingTypedefSymbol_*,_std::allocator<const_slang::ast::ForwardingTypedefSymbol_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ((__position._M_current)->members).
    super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ((__position._M_current)->forwardingTypedefs).
    super__Vector_base<const_slang::ast::ForwardingTypedefSymbol_*,_std::allocator<const_slang::ast::ForwardingTypedefSymbol_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ((__position._M_current)->members).
    super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ((__position._M_current)->members).
    super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ppDVar1 = &(this->storage).
               super__Vector_base<slang::ast::Scope::DeferredMemberData,_std::allocator<slang::ast::Scope::DeferredMemberData>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppDVar1 = *ppDVar1 + 1;
  }
  return;
}

Assistant:

SafeIndexedVector() {
        // reserve a slot for the invalid value
        storage.emplace_back();
    }